

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * parser::nonTerminalName
                   (string *__return_storage_ptr__,NonTerminal nonTerminal,
                   NonTerminalNames *nonTerminalNames)

{
  bool bVar1;
  pointer ppVar2;
  stringstream local_1b8 [8];
  stringstream stringstream;
  undefined1 local_1a8 [376];
  _Self local_30;
  _Self local_28;
  const_iterator it;
  NonTerminalNames *nonTerminalNames_local;
  string *psStack_10;
  NonTerminal nonTerminal_local;
  
  it._M_node = (_Base_ptr)nonTerminalNames;
  nonTerminalNames_local._4_4_ = nonTerminal;
  psStack_10 = __return_storage_ptr__;
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(nonTerminalNames,(key_type *)((long)&nonTerminalNames_local + 4));
  local_30._M_node =
       (_Base_ptr)
       std::
       map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(it._M_node);
  bVar1 = std::operator==(&local_28,&local_30);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::ostream::operator<<(local_1a8,nonTerminalNames_local._4_4_);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
  }
  else {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_28);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar2->second);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nonTerminalName(NonTerminal nonTerminal, NonTerminalNames const& nonTerminalNames) {
        NonTerminalNames::const_iterator it = nonTerminalNames.find(nonTerminal);
        if (it == nonTerminalNames.end()) {
            std::stringstream stringstream;
            stringstream << nonTerminal;
            return stringstream.str();
        }
        return it->second;
    }